

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_converter.cpp
# Opt level: O0

ResourceVariableMeta __thiscall
dxil_spv::Converter::Impl::get_resource_variable_meta(Impl *this,MDNode *resource)

{
  uint uVar1;
  MDOperand *md;
  ConstantExpr *this_00;
  size_type sVar2;
  ConstantExpr *constexpr_op;
  GlobalVariable *global;
  Value *val;
  ConstantAsMetadata *variable;
  MDNode *resource_local;
  Impl *this_local;
  ResourceVariableMeta meta;
  
  variable = (ConstantAsMetadata *)resource;
  resource_local = (MDNode *)this;
  memset((void *)((long)&this_local + 6),0,2);
  if (variable != (ConstantAsMetadata *)0x0) {
    md = LLVMBC::MDNode::getOperand((MDNode *)variable,1);
    val = (Value *)LLVMBC::dyn_cast<LLVMBC::ConstantAsMetadata>(md);
    if (val != (Value *)0x0) {
      global = (GlobalVariable *)LLVMBC::ConstantAsMetadata::getValue((ConstantAsMetadata *)val);
      constexpr_op = (ConstantExpr *)LLVMBC::dyn_cast<LLVMBC::GlobalVariable>((Value *)global);
      while (constexpr_op == (ConstantExpr *)0x0 && global != (GlobalVariable *)0x0) {
        this_00 = LLVMBC::dyn_cast<LLVMBC::ConstantExpr>((Value *)global);
        global = (GlobalVariable *)0x0;
        if ((this_00 != (ConstantExpr *)0x0) &&
           (uVar1 = LLVMBC::ConstantExpr::getOpcode(this_00), uVar1 == 0x70)) {
          global = (GlobalVariable *)LLVMBC::ConstantExpr::getOperand(this_00,0);
          constexpr_op = (ConstantExpr *)LLVMBC::dyn_cast<LLVMBC::GlobalVariable>((Value *)global);
        }
      }
      if (constexpr_op != (ConstantExpr *)0x0) {
        this_local._6_2_ = (ResourceVariableMeta)CONCAT11(this_local._7_1_,1);
        sVar2 = std::
                unordered_set<const_LLVMBC::GlobalVariable_*,_std::hash<const_LLVMBC::GlobalVariable_*>,_std::equal_to<const_LLVMBC::GlobalVariable_*>,_dxil_spv::ThreadLocalAllocator<const_LLVMBC::GlobalVariable_*>_>
                ::count(&this->llvm_active_global_resource_variables,(key_type *)&constexpr_op);
        this_local._6_2_ = (ResourceVariableMeta)CONCAT11(sVar2 != 0,this_local._6_1_);
        return this_local._6_2_;
      }
    }
    this_local._6_2_ = (ResourceVariableMeta)CONCAT11(true,this_local._6_1_);
  }
  return this_local._6_2_;
}

Assistant:

Converter::Impl::ResourceVariableMeta Converter::Impl::get_resource_variable_meta(const llvm::MDNode *resource) const
{
	ResourceVariableMeta meta = {};

	if (!resource)
		return meta;

	if (const auto *variable = llvm::dyn_cast<llvm::ConstantAsMetadata>(resource->getOperand(1)))
	{
		const llvm::Value *val = variable->getValue();
		const auto *global = llvm::dyn_cast<llvm::GlobalVariable>(val);

		// It's possible that the variable is a constexpr bitcast, so resolve those ...
		while (!global && val)
		{
			auto *constexpr_op = llvm::dyn_cast<llvm::ConstantExpr>(val);
			val = nullptr;

			if (constexpr_op && constexpr_op->getOpcode() == llvm::UnaryOperator::BitCast)
			{
				val = constexpr_op->getOperand(0);
				global = llvm::dyn_cast<llvm::GlobalVariable>(val);
			}
		}

		if (global)
		{
			meta.is_lib_variable = true;
			meta.is_active = llvm_active_global_resource_variables.count(global) != 0;
			return meta;
		}
	}

	meta.is_active = true;
	return meta;
}